

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

int run_ping_pong_test(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  eval_a = 1;
  eval_b = (int64_t)completed_pingers;
  if (eval_b == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    eval_a = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      iVar1 = uv_library_shutdown();
      return iVar1;
    }
    pcVar4 = "uv_loop_close(uv_default_loop())";
    pcVar3 = "0";
    uVar2 = 0x17d;
  }
  else {
    pcVar4 = "completed_pingers";
    pcVar3 = "1";
    uVar2 = 0x17b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static int run_ping_pong_test(void) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, completed_pingers);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}